

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O1

Header __thiscall
google::protobuf::internal::anon_unknown_0::ExtractHeader
          (anon_unknown_0 *this,Span<const_unsigned_int> data)

{
  if ((data.ptr_ != (pointer)0x0) && (data.ptr_ != (pointer)0x1)) {
    return (Header)((ulong)(*(uint *)this & 0xffff) |
                   (ulong)(*(uint *)(this + 4) & 0xffff) << 0x20 |
                   (ulong)(*(uint *)(this + 4) >> 0x10) << 0x30 |
                   (ulong)(*(uint *)this & 0xffff0000));
  }
  __assert_fail("false && \"i < size()\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/types/span.h"
                ,0x14d,
                "auto absl::Span<const unsigned int>::operator[](size_type)::(anonymous class)::operator()() const [T = const unsigned int]"
               );
}

Assistant:

Header ExtractHeader(absl::Span<const uint32_t> data) {
  return {
      static_cast<int16_t>(Unmake32(data[0])[0]),
      Unmake32(data[0])[1],
      Unmake32(data[1])[0],
      Unmake32(data[1])[1],
  };
}